

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<ninx::parser::element::NoopStatement,_std::default_delete<ninx::parser::element::NoopStatement>_>
 __thiscall ninx::parser::Parser::parse_operator_definition(Parser *this)

{
  TokenReader *this_00;
  int iVar1;
  Token *pTVar2;
  Limiter *this_01;
  mapped_type *pmVar3;
  ParserException *pPVar4;
  undefined8 extraout_RAX;
  Parser *in_RSI;
  allocator local_79;
  string id;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  id_ptr;
  char limiter;
  
  this_00 = &in_RSI->reader;
  pTVar2 = TokenReader::get_token(this_00);
  if (pTVar2 == (Token *)0x0) {
    pPVar4 = (ParserException *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string
              ((string *)&id,"Expected alias target, but could not find one.",(allocator *)&limiter)
    ;
    exception::ParserException::ParserException(pPVar4,(Token *)0x0,&in_RSI->origin,&id);
    __cxa_throw(pPVar4,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = (*pTVar2->_vptr_Token[2])(pTVar2);
  if (iVar1 != 0) {
    pPVar4 = (ParserException *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string
              ((string *)&id,"Alias target name must be alphanumeric, and begin with a letter.",
               (allocator *)&limiter);
    exception::ParserException::ParserException(pPVar4,pTVar2,&in_RSI->origin,&id);
    __cxa_throw(pPVar4,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error);
  }
  __dynamic_cast(pTVar2,&lexer::token::Token::typeinfo,&lexer::token::Text::typeinfo,0);
  lexer::token::Text::get_identifier_abi_cxx11_((Text *)&id_ptr);
  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )id_ptr._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl ==
      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    pPVar4 = (ParserException *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string
              ((string *)&id,
               "Invalid function name. It must be alphanumeric, and begin with a letter.",
               (allocator *)&limiter);
    exception::ParserException::ParserException(pPVar4,pTVar2,&in_RSI->origin,&id);
    __cxa_throw(pPVar4,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string
            ((string *)&id,
             (string *)
             id_ptr._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  iVar1 = TokenReader::check_type(this_00,LIMITER);
  if (iVar1 == 1) {
    pTVar2 = TokenReader::get_token(this_00);
    this_01 = (Limiter *)
              __dynamic_cast(pTVar2,&lexer::token::Token::typeinfo,&lexer::token::Limiter::typeinfo,
                             0);
    limiter = lexer::token::Limiter::get_limiter(this_01);
    pmVar3 = std::__detail::
             _Map_base<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&in_RSI->operators,&limiter);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    std::make_unique<ninx::parser::element::NoopStatement>();
    std::__cxx11::string::~string((string *)&id);
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&id_ptr);
    return (__uniq_ptr_data<ninx::parser::element::NoopStatement,_std::default_delete<ninx::parser::element::NoopStatement>,_true,_true>
            )(__uniq_ptr_data<ninx::parser::element::NoopStatement,_std::default_delete<ninx::parser::element::NoopStatement>,_true,_true>
              )this;
  }
  std::__cxx11::string::string
            ((string *)&limiter,"Expected operator, but could not find one.",&local_79);
  generate_exception(in_RSI,(string *)&limiter);
  std::__cxx11::string::~string((string *)&limiter);
  std::__cxx11::string::~string((string *)&id);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&id_ptr);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

std::unique_ptr<NoopStatement> ninx::parser::Parser::parse_operator_definition() {
    // Extract the alias identifier
    auto id_token{reader.get_token()};
    if (!id_token) {
        throw ParserException(id_token, this->origin, "Expected alias target, but could not find one.");
    }
    if (id_token->get_type() != Type::TEXT) {
        throw ParserException(id_token, this->origin, "Alias target name must be alphanumeric, and begin with a letter.");
    }
    auto id_ptr{dynamic_cast<ninx::lexer::token::Text *>(id_token)->get_identifier()};
    if (!id_ptr) {
        throw ParserException(id_token, this->origin,
                              "Invalid function name. It must be alphanumeric, and begin with a letter.");
    }
    std::string id{*id_ptr};

    // Extract the operator limiter
    if (reader.check_type(Type::LIMITER) != 1) {
        generate_exception("Expected operator, but could not find one.");
    }

    char limiter {dynamic_cast<ninx::lexer::token::Limiter*>(reader.get_token())->get_limiter()};

    // Register the limiter in the operator table
    operators[limiter] = id;

    return std::make_unique<NoopStatement>();
}